

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall
IgnoredUtestShell::runOneTest(IgnoredUtestShell *this,TestPlugin *plugin,TestResult *result)

{
  if ((this->super_UtestShell).field_0x32 == '\x01') {
    UtestShell::runOneTest(&this->super_UtestShell,plugin,result);
    return;
  }
  (*result->_vptr_TestResult[0xc])(result);
  return;
}

Assistant:

void IgnoredUtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    if (runIgnored_)
    {
        UtestShell::runOneTest(plugin, result);
        return;
    }

    result.countIgnored();
}